

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# user_geometry_device.cpp
# Opt level: O0

void embree::sphereOccludedFunc(RTCOccludedFunctionNArguments *args)

{
  undefined4 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined8 *in_RDI;
  float fVar9;
  float old_t_1;
  RTCFilterFunctionNArguments fargs_1;
  Vec3fa Ng_1;
  bool mask_1;
  int imask_1;
  float old_t;
  RTCFilterFunctionNArguments fargs;
  Vec3fa Ng;
  bool mask;
  int imask;
  RTCHit potentialHit;
  float t1;
  float t0;
  float rcpA;
  float Q;
  float D;
  float C;
  float B;
  float A;
  Vec3fa v;
  Sphere *sphere;
  Sphere *spheres;
  uint primID;
  Ray *ray;
  void *ptr;
  int *valid;
  __m128 r;
  __m128 a_3;
  vfloat4 c;
  vfloat4 b;
  vfloat4 a;
  vfloat4 c_1;
  vfloat4 b_1;
  vfloat4 a_1;
  vfloat4 c_2;
  vfloat4 b_2;
  vfloat4 a_2;
  int *local_ef8;
  long local_ef0;
  undefined8 local_ee8;
  undefined8 local_ee0;
  float *local_ed8;
  undefined4 local_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined1 local_e98 [23];
  undefined1 local_e81;
  int local_e80;
  undefined4 local_e7c;
  int *local_e78;
  long local_e70;
  undefined8 local_e68;
  undefined8 local_e60;
  float *local_e58;
  undefined4 local_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  undefined1 local_e18 [27];
  undefined1 local_dfd;
  int local_dfc;
  float local_df8;
  float local_df4;
  float local_df0;
  undefined4 local_dec;
  undefined4 local_de8;
  uint local_de4;
  undefined4 local_de0;
  uint auStack_ddc [7];
  float local_dc0;
  float local_dbc;
  float local_db8;
  float local_db4;
  float local_db0;
  float local_dac;
  undefined8 local_da8;
  undefined8 uStack_da0;
  float local_d90;
  float local_d8c;
  undefined8 local_d88;
  undefined8 uStack_d80;
  undefined8 local_d78;
  undefined8 uStack_d70;
  long local_d68;
  long local_d60;
  uint local_d54;
  undefined8 *local_d50;
  long local_d48;
  int *local_d40;
  undefined8 *local_d38;
  undefined8 *local_d30;
  undefined8 *local_d28;
  undefined8 *local_d20;
  undefined8 *local_d18;
  undefined8 *local_d10;
  undefined8 *local_d08;
  undefined8 *local_d00;
  undefined8 *local_cf8;
  undefined8 *local_cf0;
  undefined8 *local_ce8;
  undefined8 *local_ce0;
  undefined8 *local_cd8;
  undefined1 *local_cd0;
  undefined8 *local_cc8;
  undefined8 *local_cc0;
  undefined1 *local_cb8;
  undefined8 *local_cb0;
  undefined8 *local_ca8;
  undefined8 *local_ca0;
  undefined8 local_c98;
  undefined8 uStack_c90;
  undefined8 *local_c88;
  undefined8 *local_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  undefined8 *local_c68;
  undefined8 *local_c60;
  undefined8 local_c58;
  undefined8 uStack_c50;
  undefined8 *local_c40;
  undefined8 *local_c38;
  float local_c30;
  float local_c2c;
  undefined1 local_c28 [16];
  ulong local_c18;
  undefined8 uStack_c10;
  float local_bfc;
  undefined8 *local_bf8;
  undefined8 *local_bf0;
  undefined8 *local_be8;
  undefined8 *local_be0;
  undefined8 *local_bd8;
  undefined8 *local_bd0;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 *local_bb0;
  float local_ba4;
  undefined8 *local_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 *local_b80;
  float local_b74;
  undefined8 *local_b70;
  undefined1 *local_b68;
  undefined1 *local_b60;
  float local_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  undefined8 *local_b40;
  float local_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  undefined1 *local_b20;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  undefined1 *local_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  undefined8 *local_ae0;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 *local_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 *local_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 *local_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  undefined8 local_a38;
  undefined8 uStack_a30;
  undefined8 local_a28;
  undefined8 uStack_a20;
  undefined8 local_a18;
  undefined8 uStack_a10;
  undefined8 local_a08;
  undefined8 uStack_a00;
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  undefined8 local_9e8;
  undefined8 uStack_9e0;
  undefined8 local_9d8;
  undefined8 uStack_9d0;
  undefined8 *local_9c8;
  undefined8 *local_9c0;
  undefined8 *local_9b8;
  undefined8 *local_9b0;
  undefined8 *local_9a8;
  undefined8 *local_9a0;
  undefined8 *local_998;
  undefined8 *local_990;
  undefined8 *local_988;
  undefined8 *local_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 *local_960;
  undefined8 *local_958;
  undefined8 *local_950;
  undefined8 *local_948;
  undefined8 *local_940;
  undefined8 local_938;
  undefined8 uStack_930;
  undefined8 local_928;
  undefined8 uStack_920;
  undefined8 *local_910;
  undefined8 *local_908;
  undefined8 *local_900;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  undefined8 *local_8e8;
  undefined8 *local_8e0;
  undefined8 *local_8d8;
  undefined8 *local_8d0;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  undefined8 *local_8b8;
  undefined8 *local_8b0;
  undefined8 *local_8a8;
  undefined8 *local_8a0;
  undefined8 local_898;
  undefined8 uStack_890;
  undefined8 *local_880;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  undefined8 local_868;
  undefined8 uStack_860;
  undefined8 *local_850;
  undefined8 *local_848;
  undefined8 *local_840;
  undefined8 *local_838;
  undefined8 *local_830;
  undefined8 *local_828;
  undefined8 *local_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 *local_800;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  undefined8 *local_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  undefined8 local_788;
  undefined8 uStack_780;
  undefined8 local_778;
  undefined8 uStack_770;
  undefined8 local_768;
  undefined8 uStack_760;
  undefined8 local_758;
  undefined8 uStack_750;
  undefined8 local_748;
  undefined8 uStack_740;
  undefined8 local_738;
  undefined8 uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  undefined8 local_708;
  undefined8 uStack_700;
  undefined8 local_6f8;
  undefined8 uStack_6f0;
  float local_6e8;
  float fStack_6e4;
  float fStack_6e0;
  float fStack_6dc;
  undefined8 *local_6d0;
  float local_6c8;
  float fStack_6c4;
  float fStack_6c0;
  float fStack_6bc;
  undefined8 *local_6b0;
  float local_6a8;
  float fStack_6a4;
  float fStack_6a0;
  float fStack_69c;
  undefined8 *local_690;
  float local_688;
  float fStack_684;
  float fStack_680;
  float fStack_67c;
  undefined8 *local_670;
  float local_668;
  float fStack_664;
  float fStack_660;
  float fStack_65c;
  undefined8 *local_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 *local_5f0;
  undefined8 local_5e8;
  undefined8 uStack_5e0;
  undefined8 *local_5d0;
  undefined8 *local_5c8;
  undefined8 *local_5c0;
  undefined8 *local_5b8;
  undefined8 *local_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 *local_590;
  undefined8 *local_588;
  undefined8 *local_580;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  undefined8 *local_568;
  undefined8 *local_560;
  undefined8 *local_558;
  undefined8 *local_550;
  float local_548;
  float fStack_544;
  float fStack_540;
  float fStack_53c;
  undefined8 *local_538;
  undefined8 *local_530;
  undefined8 *local_528;
  undefined8 *local_520;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 *local_500;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined8 *local_4d0;
  undefined8 *local_4c8;
  undefined8 *local_4c0;
  undefined8 *local_4b8;
  undefined8 *local_4b0;
  undefined8 *local_4a8;
  undefined8 *local_4a0;
  undefined8 local_498;
  undefined8 uStack_490;
  undefined8 *local_480;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 *local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  undefined8 local_438;
  undefined8 uStack_430;
  undefined8 local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  undefined8 local_3f8;
  undefined8 uStack_3f0;
  undefined8 local_3e8;
  undefined8 uStack_3e0;
  undefined8 local_3d8;
  undefined8 uStack_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  undefined8 *local_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 *local_390;
  undefined8 *local_388;
  undefined8 *local_380;
  undefined8 *local_378;
  undefined8 *local_370;
  undefined8 local_368;
  undefined8 uStack_360;
  undefined8 *local_350;
  undefined8 *local_348;
  undefined8 *local_340;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  undefined8 *local_328;
  undefined8 *local_320;
  undefined8 *local_318;
  undefined8 *local_310;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  undefined8 *local_2f8;
  undefined8 *local_2f0;
  undefined8 *local_2e8;
  undefined8 *local_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 *local_2c0;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 *local_290;
  undefined8 *local_288;
  undefined8 *local_280;
  undefined8 *local_278;
  undefined8 *local_270;
  undefined8 *local_268;
  undefined8 *local_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 *local_240;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  undefined8 local_1e8;
  undefined8 uStack_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 *local_1c0;
  undefined8 *local_1b8;
  undefined8 *local_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 *local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined8 *local_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined1 local_108 [16];
  undefined4 local_ec;
  undefined1 local_e8 [16];
  float local_cc;
  ulong local_c8;
  undefined8 uStack_c0;
  ulong local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  ulong local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  ulong local_68;
  undefined8 uStack_60;
  float local_54;
  undefined8 *local_50;
  float local_44;
  undefined8 *local_40;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  float local_28;
  float local_18;
  float fStack_14;
  float fStack_10;
  float fStack_c;
  float fStack_8;
  
  local_d40 = (int *)*in_RDI;
  local_d60 = in_RDI[1];
  local_d50 = (undefined8 *)in_RDI[4];
  local_d54 = *(uint *)(in_RDI + 2);
  local_d68 = local_d60 + (ulong)local_d54 * 0x40;
  if (*local_d40 != 0) {
    *local_d40 = 0;
    local_ce8 = &local_d88;
    local_af8 = *local_d50;
    uStack_af0 = local_d50[1];
    local_cb0 = (undefined8 *)(local_d68 + 0x10);
    local_ca0 = &local_d78;
    uVar2 = *local_cb0;
    uVar3 = *(undefined8 *)(local_d68 + 0x18);
    local_a68._0_4_ = (float)local_af8;
    local_a68._4_4_ = (float)((ulong)local_af8 >> 0x20);
    uStack_a60._0_4_ = (float)uStack_af0;
    uStack_a60._4_4_ = (float)((ulong)uStack_af0 >> 0x20);
    local_a78._0_4_ = (float)uVar2;
    local_a78._4_4_ = (float)((ulong)uVar2 >> 0x20);
    uStack_a70._0_4_ = (float)uVar3;
    uStack_a70._4_4_ = (float)((ulong)uVar3 >> 0x20);
    local_b58 = (float)local_a68 - (float)local_a78;
    fStack_b54 = local_a68._4_4_ - local_a78._4_4_;
    fStack_b50 = (float)uStack_a60 - (float)uStack_a70;
    fStack_b4c = uStack_a60._4_4_ - uStack_a70._4_4_;
    local_178 = CONCAT44(fStack_b54,local_b58);
    uStack_170 = CONCAT44(fStack_b4c,fStack_b50);
    local_c88 = local_d50 + 2;
    local_9c8 = &local_c98;
    uVar4 = *local_c88;
    uVar5 = local_d50[3];
    uVar6 = *local_c88;
    uVar7 = local_d50[3];
    local_738._0_4_ = (float)uVar4;
    local_738._4_4_ = (float)((ulong)uVar4 >> 0x20);
    uStack_730._0_4_ = (float)uVar5;
    uStack_730._4_4_ = (float)((ulong)uVar5 >> 0x20);
    local_748._0_4_ = (float)uVar6;
    local_748._4_4_ = (float)((ulong)uVar6 >> 0x20);
    uStack_740._0_4_ = (float)uVar7;
    uStack_740._4_4_ = (float)((ulong)uVar7 >> 0x20);
    local_6e8 = (float)local_738 * (float)local_748;
    local_878 = local_738._4_4_ * local_748._4_4_;
    local_7f8 = (float)uStack_730 * (float)uStack_740;
    fStack_6dc = uStack_730._4_4_ * uStack_740._4_4_;
    local_978 = CONCAT44(local_878,local_6e8);
    uStack_970 = CONCAT44(fStack_6dc,local_7f8);
    local_960 = &local_9d8;
    local_950 = &local_9e8;
    local_898 = CONCAT44(local_878,local_878);
    uStack_890 = CONCAT44(local_878,local_878);
    local_940 = &local_9f8;
    local_818 = CONCAT44(local_7f8,local_7f8);
    uStack_810 = CONCAT44(local_7f8,local_7f8);
    local_908 = &local_a18;
    local_8c8 = local_6e8 + local_878;
    fStack_8c4 = local_878 + local_878;
    fStack_8c0 = local_7f8 + local_878;
    fStack_8bc = fStack_6dc + local_878;
    local_798 = CONCAT44(fStack_8c4,local_8c8);
    uStack_790 = CONCAT44(fStack_8bc,fStack_8c0);
    local_900 = &local_a08;
    local_d8c = local_8c8 + local_7f8;
    fStack_8f4 = fStack_8c4 + local_7f8;
    fStack_8f0 = fStack_8c0 + local_7f8;
    fStack_8ec = fStack_8bc + local_7f8;
    local_938 = CONCAT44(fStack_8f4,local_d8c);
    uStack_930 = CONCAT44(fStack_8ec,fStack_8f0);
    local_d00 = local_d50 + 2;
    local_cf8 = &local_da8;
    local_ad8 = *local_d00;
    uStack_ad0 = local_d50[3];
    local_5f0 = &local_c58;
    local_188._0_4_ = (float)local_ad8;
    local_188._4_4_ = (float)((ulong)local_ad8 >> 0x20);
    uStack_180._0_4_ = (float)uStack_ad0;
    uStack_180._4_4_ = (float)((ulong)uStack_ad0 >> 0x20);
    local_1a8 = local_b58 * (float)local_188;
    local_4f8 = fStack_b54 * local_188._4_4_;
    local_478 = fStack_b50 * (float)uStack_180;
    fStack_19c = fStack_b4c * uStack_180._4_4_;
    local_5e8 = CONCAT44(local_4f8,local_1a8);
    uStack_5e0 = CONCAT44(fStack_19c,local_478);
    local_5d0 = &local_608;
    local_5c0 = &local_618;
    local_518 = CONCAT44(local_4f8,local_4f8);
    uStack_510 = CONCAT44(local_4f8,local_4f8);
    local_5b0 = &local_628;
    local_498 = CONCAT44(local_478,local_478);
    uStack_490 = CONCAT44(local_478,local_478);
    local_588 = &local_648;
    local_548 = local_1a8 + local_4f8;
    fStack_544 = local_4f8 + local_4f8;
    fStack_540 = local_478 + local_4f8;
    fStack_53c = fStack_19c + local_4f8;
    local_418 = CONCAT44(fStack_544,local_548);
    uStack_410 = CONCAT44(fStack_53c,fStack_540);
    local_580 = &local_638;
    local_578 = local_548 + local_478;
    fStack_574 = fStack_544 + local_478;
    fStack_570 = fStack_540 + local_478;
    fStack_56c = fStack_53c + local_478;
    local_5a8 = CONCAT44(fStack_574,local_578);
    uStack_5a0 = CONCAT44(fStack_56c,fStack_570);
    local_d90 = local_578 + local_578;
    local_3b0 = &local_c78;
    local_148 = local_b58 * local_b58;
    local_2b8 = fStack_b54 * fStack_b54;
    local_238 = fStack_b50 * fStack_b50;
    fStack_13c = fStack_b4c * fStack_b4c;
    local_3a8 = CONCAT44(local_2b8,local_148);
    uStack_3a0 = CONCAT44(fStack_13c,local_238);
    local_390 = &local_3c8;
    local_380 = &local_3d8;
    local_2d8 = CONCAT44(local_2b8,local_2b8);
    uStack_2d0 = CONCAT44(local_2b8,local_2b8);
    local_370 = &local_3e8;
    local_258 = CONCAT44(local_238,local_238);
    uStack_250 = CONCAT44(local_238,local_238);
    local_348 = &local_408;
    local_308 = local_148 + local_2b8;
    fStack_304 = local_2b8 + local_2b8;
    fStack_300 = local_238 + local_2b8;
    fStack_2fc = fStack_13c + local_2b8;
    local_1d8 = CONCAT44(fStack_304,local_308);
    uStack_1d0 = CONCAT44(fStack_2fc,fStack_300);
    local_340 = &local_3f8;
    local_338 = local_308 + local_238;
    fStack_334 = fStack_304 + local_238;
    fStack_330 = fStack_300 + local_238;
    fStack_32c = fStack_2fc + local_238;
    local_368 = CONCAT44(fStack_334,local_338);
    uStack_360 = CONCAT44(fStack_32c,fStack_330);
    local_c30 = *(float *)(local_d68 + 0x20);
    local_dac = local_338 - local_c30 * local_c30;
    local_db0 = local_d90 * local_d90 + -(local_d8c * 4.0 * local_dac);
    if (0.0 <= local_db0) {
      local_d48 = local_d60;
      local_d38 = in_RDI;
      local_cf0 = local_d50;
      local_ca8 = local_ce8;
      local_c80 = local_c88;
      local_c68 = local_ca0;
      local_c60 = local_ca0;
      local_c40 = local_cf8;
      local_c38 = local_ca0;
      local_c2c = local_db0;
      local_b40 = local_ca0;
      local_ae0 = local_ce8;
      local_ac0 = local_cf8;
      local_a78 = uVar2;
      uStack_a70 = uVar3;
      local_a68 = local_af8;
      uStack_a60 = uStack_af0;
      local_990 = local_c88;
      local_988 = local_c88;
      local_980 = local_9c8;
      local_958 = local_960;
      local_948 = local_960;
      local_910 = local_940;
      local_8f8 = local_d8c;
      local_8e8 = local_900;
      local_8e0 = local_950;
      local_8d8 = local_960;
      local_8d0 = local_908;
      local_8b8 = local_908;
      local_8b0 = local_900;
      local_8a8 = local_960;
      local_8a0 = local_950;
      local_880 = local_950;
      fStack_874 = local_878;
      fStack_870 = local_878;
      fStack_86c = local_878;
      local_868 = local_978;
      uStack_860 = uStack_970;
      local_850 = local_960;
      local_848 = local_950;
      local_840 = local_960;
      local_838 = local_940;
      local_830 = local_908;
      local_828 = local_960;
      local_820 = local_940;
      local_800 = local_940;
      fStack_7f4 = local_7f8;
      fStack_7f0 = local_7f8;
      fStack_7ec = local_7f8;
      local_7e8 = local_978;
      uStack_7e0 = uStack_970;
      local_7d0 = local_960;
      local_7c8 = local_898;
      uStack_7c0 = uStack_890;
      local_7b8 = local_978;
      uStack_7b0 = uStack_970;
      local_7a8 = local_818;
      uStack_7a0 = uStack_810;
      local_748 = uVar6;
      uStack_740 = uVar7;
      local_738 = uVar4;
      uStack_730 = uVar5;
      fStack_6e4 = local_878;
      fStack_6e0 = local_7f8;
      local_6d0 = local_9c8;
      local_5c8 = local_5d0;
      local_5b8 = local_5d0;
      local_590 = local_5b0;
      local_568 = local_580;
      local_560 = local_5c0;
      local_558 = local_5d0;
      local_550 = local_588;
      local_538 = local_588;
      local_530 = local_580;
      local_528 = local_5d0;
      local_520 = local_5c0;
      local_500 = local_5c0;
      fStack_4f4 = local_4f8;
      fStack_4f0 = local_4f8;
      fStack_4ec = local_4f8;
      local_4e8 = local_5e8;
      uStack_4e0 = uStack_5e0;
      local_4d0 = local_5d0;
      local_4c8 = local_5c0;
      local_4c0 = local_5d0;
      local_4b8 = local_5b0;
      local_4b0 = local_588;
      local_4a8 = local_5d0;
      local_4a0 = local_5b0;
      local_480 = local_5b0;
      fStack_474 = local_478;
      fStack_470 = local_478;
      fStack_46c = local_478;
      local_468 = local_5e8;
      uStack_460 = uStack_5e0;
      local_450 = local_5d0;
      local_448 = local_518;
      uStack_440 = uStack_510;
      local_438 = local_5e8;
      uStack_430 = uStack_5e0;
      local_428 = local_498;
      uStack_420 = uStack_490;
      local_388 = local_390;
      local_378 = local_390;
      local_350 = local_370;
      local_328 = local_340;
      local_320 = local_380;
      local_318 = local_390;
      local_310 = local_348;
      local_2f8 = local_348;
      local_2f0 = local_340;
      local_2e8 = local_390;
      local_2e0 = local_380;
      local_2c0 = local_380;
      fStack_2b4 = local_2b8;
      fStack_2b0 = local_2b8;
      fStack_2ac = local_2b8;
      local_2a8 = local_3a8;
      uStack_2a0 = uStack_3a0;
      local_290 = local_390;
      local_288 = local_380;
      local_280 = local_390;
      local_278 = local_370;
      local_270 = local_348;
      local_268 = local_390;
      local_260 = local_370;
      local_240 = local_370;
      fStack_234 = local_238;
      fStack_230 = local_238;
      fStack_22c = local_238;
      local_228 = local_3a8;
      uStack_220 = uStack_3a0;
      local_210 = local_390;
      local_208 = local_2d8;
      uStack_200 = uStack_2d0;
      local_1f8 = local_3a8;
      uStack_1f0 = uStack_3a0;
      local_1e8 = local_258;
      uStack_1e0 = uStack_250;
      local_1c0 = local_cf8;
      local_1b8 = local_ca0;
      local_1b0 = local_5f0;
      fStack_1a4 = local_4f8;
      fStack_1a0 = local_478;
      local_190 = local_5f0;
      local_188 = local_ad8;
      uStack_180 = uStack_ad0;
      local_160 = local_ca0;
      local_158 = local_ca0;
      local_150 = local_3b0;
      fStack_144 = local_2b8;
      fStack_140 = local_238;
      local_130 = local_3b0;
      local_128 = local_178;
      uStack_120 = uStack_170;
      local_118 = local_178;
      uStack_110 = uStack_170;
      local_da8 = local_ad8;
      uStack_da0 = uStack_ad0;
      local_d88 = local_af8;
      uStack_d80 = uStack_af0;
      local_d78 = local_178;
      uStack_d70 = uStack_170;
      local_c98 = local_978;
      uStack_c90 = uStack_970;
      local_c78 = local_3a8;
      uStack_c70 = uStack_3a0;
      local_c58 = local_5e8;
      uStack_c50 = uStack_5e0;
      local_a18 = local_798;
      uStack_a10 = uStack_790;
      local_a08 = local_938;
      uStack_a00 = uStack_930;
      local_9f8 = local_818;
      uStack_9f0 = uStack_810;
      local_9e8 = local_898;
      uStack_9e0 = uStack_890;
      local_9d8 = local_978;
      uStack_9d0 = uStack_970;
      local_648 = local_418;
      uStack_640 = uStack_410;
      local_638 = local_5a8;
      uStack_630 = uStack_5a0;
      local_628 = local_498;
      uStack_620 = uStack_490;
      local_618 = local_518;
      uStack_610 = uStack_510;
      local_608 = local_5e8;
      uStack_600 = uStack_5e0;
      local_408 = local_1d8;
      uStack_400 = uStack_1d0;
      local_3f8 = local_368;
      uStack_3f0 = uStack_360;
      local_3e8 = local_258;
      uStack_3e0 = uStack_250;
      local_3d8 = local_2d8;
      uStack_3d0 = uStack_2d0;
      local_3c8 = local_3a8;
      uStack_3c0 = uStack_3a0;
      local_db4 = sqrtf(local_db0);
      local_bfc = local_d8c;
      local_cc = local_d8c;
      local_e8._4_4_ = 0;
      local_e8._0_4_ = local_d8c;
      local_c18 = local_e8._0_8_;
      uStack_c10 = 0;
      local_c8 = local_e8._0_8_;
      uStack_c0 = 0;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = local_e8._0_8_;
      local_c28 = rcpss(auVar8,auVar8);
      local_ec = 0x40000000;
      local_108 = ZEXT416(0x40000000);
      local_98 = local_e8._0_8_;
      uStack_90 = 0;
      local_88._0_4_ = local_c28._0_4_;
      local_db8 = (float)local_88;
      local_88._4_4_ = local_c28._4_4_;
      local_88._0_4_ = (float)local_88 * local_d8c;
      uStack_920 = local_c28._8_8_;
      local_78 = local_88;
      fVar9 = 2.0 - (float)local_88;
      local_68 = (ulong)(uint)fVar9;
      uStack_60 = 0;
      local_b8 = local_68;
      uStack_b0 = 0;
      local_db8 = local_db8 * fVar9;
      local_a8 = CONCAT44(local_88._4_4_,local_db8);
      local_928 = local_a8;
      local_dbc = local_db8 * 0.5 * (-local_d90 - local_db4);
      local_dc0 = local_db8 * 0.5 * (-local_d90 + local_db4);
      local_dec = 0;
      local_de8 = 0;
      local_e8 = ZEXT416((uint)local_d8c);
      uStack_a0 = uStack_920;
      uStack_80 = uStack_920;
      uStack_70 = uStack_920;
      copyInstanceIdStack((RTCRayQueryContext *)local_d38[3],auStack_ddc);
      local_de0 = *(undefined4 *)(local_d68 + 0x30);
      local_de4 = local_d54;
      local_d28 = local_d50;
      if (*(float *)((long)local_d50 + 0xc) < local_dbc && local_dbc < *(float *)(local_d50 + 4)) {
        local_dfd = 1;
        local_dfc = -1;
        local_b80 = local_d50 + 2;
        local_b70 = &local_e48;
        local_b74 = local_dbc;
        local_50 = &local_b98;
        local_54 = local_dbc;
        fStack_8 = local_dbc;
        local_18 = local_dbc;
        fStack_14 = local_dbc;
        fStack_10 = local_dbc;
        fStack_c = local_dbc;
        local_6f8 = CONCAT44(local_dbc,local_dbc);
        uStack_6f0 = CONCAT44(local_dbc,local_dbc);
        local_9b0 = &local_e48;
        local_9b8 = &local_b98;
        uVar2 = *local_b80;
        uVar3 = local_d50[3];
        local_708._0_4_ = (float)uVar2;
        local_708._4_4_ = (float)((ulong)uVar2 >> 0x20);
        uStack_700._0_4_ = (float)uVar3;
        uStack_700._4_4_ = (float)((ulong)uVar3 >> 0x20);
        local_6a8 = local_dbc * (float)local_708;
        fStack_6a4 = local_dbc * local_708._4_4_;
        fStack_6a0 = local_dbc * (float)uStack_700;
        fStack_69c = local_dbc * uStack_700._4_4_;
        local_690 = &local_e48;
        local_788 = CONCAT44(fStack_6a4,local_6a8);
        uStack_780 = CONCAT44(fStack_69c,fStack_6a0);
        local_bd0 = &local_e38;
        local_bd8 = local_d50;
        local_be0 = &local_e48;
        uVar4 = *local_d50;
        uVar5 = local_d50[1];
        local_778._0_4_ = (float)uVar4;
        local_778._4_4_ = (float)((ulong)uVar4 >> 0x20);
        uStack_770._0_4_ = (float)uVar5;
        uStack_770._4_4_ = (float)((ulong)uVar5 >> 0x20);
        local_688 = (float)local_778 + local_6a8;
        fStack_684 = local_778._4_4_ + fStack_6a4;
        fStack_680 = (float)uStack_770 + fStack_6a0;
        fStack_67c = uStack_770._4_4_ + fStack_69c;
        local_670 = &local_e38;
        local_ab8 = CONCAT44(fStack_684,local_688);
        uStack_ab0 = CONCAT44(fStack_67c,fStack_680);
        local_d08 = &local_e28;
        local_d10 = &local_e38;
        local_aa0 = &local_e28;
        local_cc8 = (undefined8 *)(local_d68 + 0x10);
        local_cb8 = local_e18;
        local_cc0 = &local_e28;
        uVar6 = *local_cc8;
        uVar7 = *(undefined8 *)(local_d68 + 0x18);
        local_a58._0_4_ = (float)uVar6;
        local_a58._4_4_ = (float)((ulong)uVar6 >> 0x20);
        uStack_a50._0_4_ = (float)uVar7;
        uStack_a50._4_4_ = (float)((ulong)uVar7 >> 0x20);
        local_df8 = local_688 - (float)local_a58;
        local_df4 = fStack_684 - local_a58._4_4_;
        local_df0 = fStack_680 - (float)uStack_a50;
        fStack_b2c = fStack_67c - uStack_a50._4_4_;
        local_b20 = local_e18;
        local_e78 = &local_dfc;
        local_e70 = local_d48;
        local_e68 = local_d38[3];
        local_e60 = local_d38[4];
        local_e58 = &local_df8;
        local_e50 = 1;
        local_e7c = *(undefined4 *)(local_d50 + 4);
        *(float *)(local_d50 + 4) = local_dbc;
        local_b38 = local_df8;
        fStack_b34 = local_df4;
        fStack_b30 = local_df0;
        local_a58 = uVar6;
        uStack_a50 = uVar7;
        local_a48 = local_ab8;
        uStack_a40 = uStack_ab0;
        local_9c0 = local_b80;
        local_778 = uVar4;
        uStack_770 = uVar5;
        local_708 = uVar2;
        uStack_700 = uVar3;
        local_e48 = local_788;
        uStack_e40 = uStack_780;
        local_e38 = local_ab8;
        uStack_e30 = uStack_ab0;
        local_e28 = local_ab8;
        uStack_e20 = uStack_ab0;
        local_b98 = local_6f8;
        uStack_b90 = uStack_6f0;
        rtcInvokeOccludedFilterFromGeometry(local_d38,&local_e78);
        if (local_dfc == -1) {
          local_b60 = &neg_inf;
          fVar9 = std::numeric_limits<float>::infinity();
          *(float *)(local_d50 + 4) = -fVar9;
          *local_d40 = -1;
        }
        else {
          *(undefined4 *)(local_d50 + 4) = local_e7c;
        }
      }
      local_d30 = local_d50;
      if (*(float *)((long)local_d50 + 0xc) < local_dc0 && local_dc0 < *(float *)(local_d50 + 4)) {
        local_e81 = 1;
        local_e80 = -1;
        local_bb0 = local_d50 + 2;
        local_ba0 = &local_ec8;
        local_ba4 = local_dc0;
        local_40 = &local_bc8;
        local_44 = local_dc0;
        local_28 = local_dc0;
        local_38 = local_dc0;
        fStack_34 = local_dc0;
        fStack_30 = local_dc0;
        fStack_2c = local_dc0;
        local_718 = CONCAT44(local_dc0,local_dc0);
        uStack_710 = CONCAT44(local_dc0,local_dc0);
        local_998 = &local_ec8;
        local_9a0 = &local_bc8;
        uVar2 = *local_bb0;
        uVar3 = local_d50[3];
        local_728._0_4_ = (float)uVar2;
        local_728._4_4_ = (float)((ulong)uVar2 >> 0x20);
        uStack_720._0_4_ = (float)uVar3;
        uStack_720._4_4_ = (float)((ulong)uVar3 >> 0x20);
        local_6c8 = local_dc0 * (float)local_728;
        fStack_6c4 = local_dc0 * local_728._4_4_;
        fStack_6c0 = local_dc0 * (float)uStack_720;
        fStack_6bc = local_dc0 * uStack_720._4_4_;
        local_6b0 = &local_ec8;
        local_768 = CONCAT44(fStack_6c4,local_6c8);
        uStack_760 = CONCAT44(fStack_6bc,fStack_6c0);
        local_be8 = &local_eb8;
        local_bf0 = local_d50;
        local_bf8 = &local_ec8;
        uVar4 = *local_d50;
        uVar5 = local_d50[1];
        local_758._0_4_ = (float)uVar4;
        local_758._4_4_ = (float)((ulong)uVar4 >> 0x20);
        uStack_750._0_4_ = (float)uVar5;
        uStack_750._4_4_ = (float)((ulong)uVar5 >> 0x20);
        local_668 = (float)local_758 + local_6c8;
        fStack_664 = local_758._4_4_ + fStack_6c4;
        fStack_660 = (float)uStack_750 + fStack_6c0;
        fStack_65c = uStack_750._4_4_ + fStack_6bc;
        local_650 = &local_eb8;
        local_a98 = CONCAT44(fStack_664,local_668);
        uStack_a90 = CONCAT44(fStack_65c,fStack_660);
        local_d18 = &local_ea8;
        local_d20 = &local_eb8;
        local_a80 = &local_ea8;
        local_ce0 = (undefined8 *)(local_d68 + 0x10);
        local_cd0 = local_e98;
        local_cd8 = &local_ea8;
        uVar6 = *local_ce0;
        uVar7 = *(undefined8 *)(local_d68 + 0x18);
        local_a38._0_4_ = (float)uVar6;
        local_a38._4_4_ = (float)((ulong)uVar6 >> 0x20);
        uStack_a30._0_4_ = (float)uVar7;
        uStack_a30._4_4_ = (float)((ulong)uVar7 >> 0x20);
        local_df8 = local_668 - (float)local_a38;
        local_df4 = fStack_664 - local_a38._4_4_;
        local_df0 = fStack_660 - (float)uStack_a30;
        fStack_b0c = fStack_65c - uStack_a30._4_4_;
        local_b00 = local_e98;
        local_ef8 = &local_e80;
        local_ef0 = local_d48;
        local_ee8 = local_d38[3];
        local_ee0 = local_d38[4];
        local_ed8 = &local_df8;
        local_ed0 = 1;
        uVar1 = *(undefined4 *)(local_d50 + 4);
        *(float *)(local_d50 + 4) = local_dc0;
        local_b18 = local_df8;
        fStack_b14 = local_df4;
        fStack_b10 = local_df0;
        local_a38 = uVar6;
        uStack_a30 = uVar7;
        local_a28 = local_a98;
        uStack_a20 = uStack_a90;
        local_9a8 = local_bb0;
        local_758 = uVar4;
        uStack_750 = uVar5;
        local_728 = uVar2;
        uStack_720 = uVar3;
        local_ec8 = local_768;
        uStack_ec0 = uStack_760;
        local_eb8 = local_a98;
        uStack_eb0 = uStack_a90;
        local_ea8 = local_a98;
        uStack_ea0 = uStack_a90;
        local_bc8 = local_718;
        uStack_bc0 = uStack_710;
        rtcInvokeOccludedFilterFromGeometry(local_d38,&local_ef8);
        if (local_e80 == -1) {
          local_b68 = &neg_inf;
          fVar9 = std::numeric_limits<float>::infinity();
          *(float *)(local_d50 + 4) = -fVar9;
          *local_d40 = -1;
        }
        else {
          *(undefined4 *)(local_d50 + 4) = uVar1;
        }
      }
    }
  }
  return;
}

Assistant:

RTC_SYCL_INDIRECTLY_CALLABLE void sphereOccludedFunc(const RTCOccludedFunctionNArguments* args)
{
  int* valid = args->valid;
  void* ptr  = args->geometryUserPtr;
  Ray *ray = (Ray*)args->ray;
  unsigned int primID = args->primID;
  
  assert(args->N == 1);
  const Sphere* spheres = (const Sphere*) ptr;
  const Sphere& sphere = spheres[primID];
  
  if (!valid[0]) return;
  valid[0] = 0;

  const Vec3fa v = ray->org-sphere.p;
  const float A = dot(ray->dir,ray->dir);
  const float B = 2.0f*dot(v,ray->dir);
  const float C = dot(v,v) - sqr(sphere.r);
  const float D = B*B - 4.0f*A*C;
  if (D < 0.0f) return;
  const float Q = sqrt(D);
  const float rcpA = rcp(A);
  const float t0 = 0.5f*rcpA*(-B-Q);
  const float t1 = 0.5f*rcpA*(-B+Q);

  RTCHit potentialHit;
  potentialHit.u = 0.0f;
  potentialHit.v = 0.0f;
  copyInstanceIdStack(args->context, potentialHit.instID);
  potentialHit.geomID = sphere.geomID;
  potentialHit.primID = primID;
  if ((ray->tnear() < t0) & (t0 < ray->tfar))
  {
    int imask;
    bool mask = 1;
    {
      imask = mask ? -1 : 0;
    }
    
    const Vec3fa Ng = ray->org+t0*ray->dir-sphere.p;
    potentialHit.Ng_x = Ng.x;
    potentialHit.Ng_y = Ng.y;
    potentialHit.Ng_z = Ng.z;

    RTCFilterFunctionNArguments fargs;
    fargs.valid = (int*)&imask;
    fargs.geometryUserPtr = ptr;
    fargs.context = args->context;
    fargs.ray = args->ray;
    fargs.hit = (RTCHitN*)&potentialHit;
    fargs.N = 1;

    const float old_t = ray->tfar;
    ray->tfar = t0;
#if USE_ARGUMENT_CALLBACKS
    contextFilterFunction(&fargs);
#else
    rtcInvokeOccludedFilterFromGeometry(args,&fargs);
#endif
    
    if (imask == -1) {
      ray->tfar = neg_inf;
      valid[0] = -1;
    }
    else
      ray->tfar = old_t;
  }

  if ((ray->tnear() < t1) & (t1 < ray->tfar))
  {
    int imask;
    bool mask = 1;
    {
      imask = mask ? -1 : 0;
    }
    
    const Vec3fa Ng = ray->org+t1*ray->dir-sphere.p;
    potentialHit.Ng_x = Ng.x;
    potentialHit.Ng_y = Ng.y;
    potentialHit.Ng_z = Ng.z;

    RTCFilterFunctionNArguments fargs;
    fargs.valid = (int*)&imask;
    fargs.geometryUserPtr = ptr;
    fargs.context = args->context;
    fargs.ray = args->ray;
    fargs.hit = (RTCHitN*)&potentialHit;
    fargs.N = 1;

    const float old_t = ray->tfar;
    ray->tfar = t1;
#if USE_ARGUMENT_CALLBACKS
    contextFilterFunction(&fargs);
#else
    rtcInvokeOccludedFilterFromGeometry(args,&fargs);
#endif

    if (imask == -1) {
      ray->tfar = neg_inf;
      valid[0] = -1;
    }
    else
      ray->tfar = old_t;
  }
}